

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::ShaderSourceSplitCase::test(ShaderSourceSplitCase *this)

{
  size_type *this_00;
  bool bVar1;
  TestLog *pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  deUint32 dVar5;
  long lVar6;
  size_t ndx;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  int lastStringLength;
  ShaderSources sources;
  string lastString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  Shader shader;
  string padding;
  
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sources.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sources.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  glu::Shader::Shader(&shader,((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx,
                      this->m_shaderType);
  bVar1 = this->m_explicitLengths;
  generateFullSource_abi_cxx11_(&local_238,this);
  cVar10 = '\n';
  if (bVar1 == false) {
    cVar10 = '\0';
  }
  uVar8 = this->m_numSlices;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)uVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_238._M_string_length;
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  std::__cxx11::string::_M_construct((ulong)&padding,cVar10);
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_238);
    std::operator+(&lastString,&local_258,&padding);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sources,
               &lastString);
    std::__cxx11::string::~string((string *)&lastString);
    std::__cxx11::string::~string((string *)&local_258);
    if (bVar1 != false) {
      lastString._M_dataplus._M_p._0_4_ = SUB164(auVar4 / auVar3,0);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sources.lengths,(int *)&lastString)
      ;
    }
  }
  if (local_238._M_string_length != (long)(int)uVar8 * SUB168(auVar4 / auVar3,0)) {
    std::__cxx11::string::substr((ulong)&lastString,(ulong)&local_238);
    lastStringLength = (int)lastString._M_string_length;
    std::operator+(&local_258,&lastString,&padding);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sources,
               &local_258);
    std::__cxx11::string::~string((string *)&local_258);
    if (bVar1 != false) {
      std::vector<int,_std::allocator<int>_>::push_back(&sources.lengths,&lastStringLength);
    }
    std::__cxx11::string::~string((string *)&lastString);
  }
  std::__cxx11::string::~string((string *)&padding);
  if (this->m_randomNullTerm == true) {
    iVar11 = this->m_numSlices;
    padding._M_dataplus._M_p = padding._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&lastString,
               (long)sources.strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)sources.strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type_conflict1 *)&padding
               ,(allocator_type *)&local_258);
    uVar8 = iVar11 >> 2;
    lVar6 = (long)(int)((ulong)((long)sources.strings.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)sources.strings.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    lVar7 = 0;
    if (lVar6 < 1) {
      lVar6 = lVar7;
    }
    for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
      *(int *)(lastString._M_dataplus._M_p + lVar7 * 4) = (int)lVar7;
    }
    last._M_current._4_4_ = lastString._M_string_length._4_4_;
    last._M_current._0_4_ = (int)lastString._M_string_length;
    de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&this->m_rnd,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               lastString._M_dataplus._M_p,last);
    uVar9 = 1;
    if (1 < (int)uVar8) {
      uVar9 = (ulong)uVar8;
    }
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      iVar11 = *(int *)(lastString._M_dataplus._M_p + uVar12 * 4);
      std::__cxx11::string::substr
                ((ulong)&padding,
                 (ulong)(sources.strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar11));
      std::__cxx11::string::_M_assign
                ((string *)
                 (sources.strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar11));
      dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
      sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar11] = dVar5 % 10 - 10;
      std::__cxx11::string::~string((string *)&padding);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&lastString);
  }
  std::__cxx11::string::~string((string *)&local_238);
  lastString._M_dataplus._M_p = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&padding,
             (long)sources.strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)sources.strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&lastString,
             (allocator_type *)&local_258);
  lVar6 = 0;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)sources.strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)sources.strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
    *(undefined8 *)(padding._M_dataplus._M_p + lVar6) =
         *(undefined8 *)
          ((long)&((sources.strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6 * 4);
    lVar6 = lVar6 + 8;
  }
  iVar11 = (int)(padding._M_string_length - (long)padding._M_dataplus._M_p >> 3);
  if (sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    glu::Shader::setSources(&shader,iVar11,(char **)padding._M_dataplus._M_p,(int *)0x0);
  }
  else {
    glu::Shader::setSources
              (&shader,iVar11,(char **)padding._M_dataplus._M_p,
               sources.lengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&padding);
  glu::Shader::compile(&shader);
  buildProgram(this,&shader);
  if (shader.m_info.compileOk == false) {
    this_00 = &padding._M_string_length;
    padding._M_dataplus._M_p = (pointer)pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Compilation failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&padding,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compile failed");
  }
  glu::Shader::~Shader(&shader);
  Functional::anon_unknown_0::ShaderSources::~ShaderSources(&sources);
  return;
}

Assistant:

void test (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		glu::RenderContext&	renderCtx	= m_context.getRenderContext();

		ShaderSources		sources;
		glu::Shader			shader		(renderCtx, m_shaderType);

		generateSources(sources);
		setShaderSources(shader, sources);
		shader.compile();

		buildProgram(shader);

		if (!shader.getCompileStatus())
		{
			log << TestLog::Message << "Compilation failed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		}
	}